

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O2

void __thiscall SpriteBase::make_alpha_mask(SpriteBase *this)

{
  uint8_t *puVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  byte bVar5;
  
  puVar1 = this->data;
  uVar2 = this->height * this->width;
  bVar3 = 0xff;
  for (uVar4 = 0; (uVar4 & 0xffffffff) <= uVar2 && uVar2 - (uVar4 & 0xffffffff) != 0;
      uVar4 = uVar4 + 1) {
    if (puVar1[uVar4 * 4 + 3] != '\0') {
      bVar5 = ~(byte)(int)((double)puVar1[uVar4 * 4] * 0.07 +
                          (double)puVar1[uVar4 * 4 + 2] * 0.21 +
                          (double)puVar1[uVar4 * 4 + 1] * 0.72);
      puVar1[uVar4 * 4 + 3] = bVar5;
      puVar1[uVar4 * 4 + 2] = '\0';
      (puVar1 + uVar4 * 4)[0] = '\0';
      (puVar1 + uVar4 * 4)[1] = '\0';
      if (bVar5 <= bVar3) {
        bVar3 = bVar5;
      }
    }
  }
  for (uVar4 = 0; (uVar4 & 0xffffffff) <= uVar2 && uVar2 - (uVar4 & 0xffffffff) != 0;
      uVar4 = uVar4 + 1) {
    if (puVar1[uVar4 * 4 + 3] != '\0') {
      puVar1[uVar4 * 4 + 3] = puVar1[uVar4 * 4 + 3] - bVar3;
    }
  }
  return;
}

Assistant:

void
SpriteBase::make_alpha_mask() {
  Color *c = reinterpret_cast<Color*>(data);
  uint8_t min = 0xFF;
  for (unsigned int i = 0; i < width * height; i++) {
    if (c->alpha != 0x00) {
      c->alpha = 0xff - static_cast<uint8_t>((0.21 * c->red) +
                                             (0.72 * c->green) +
                                             (0.07 * c->blue));
      c->red = 0;
      c->green = 0;
      c->blue = 0;
      min = std::min(min, c->alpha);
    }
    c++;
  }

  c = reinterpret_cast<Color*>(data);
  for (unsigned int i = 0; i < width * height; i++) {
    if (c->alpha != 0x00) {
      c->alpha = c->alpha - min;
    }
    c++;
  }
}